

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O3

QColor __thiscall QColormap::colorAt(QColormap *this,uint pixel)

{
  QColor QVar1;
  ushort uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined4 local_20;
  ushort uStack_1a;
  undefined4 uStack_18;
  undefined2 uStack_12;
  
  if (this->d->mode == Direct) {
    if (this->d->depth == 0x10) {
      pixel = ((pixel & 0x7e0) >> 9 | (pixel & 0x7e0) >> 3) << 8 |
              (pixel >> 0xd & 7 | pixel >> 8 & 0xf8) << 0x10 |
              ((pixel & 0x1f) >> 2) + (pixel & 0x1f) * 8;
    }
    local_20 = 1;
    uStack_1a = (ushort)((pixel >> 0x10) << 8) | (ushort)(pixel >> 0x10) & 0xff;
    uVar3 = pixel >> 8 & 0xff;
    uVar2 = (ushort)pixel & 0xff;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (ulong)uVar3 | (ulong)uVar2 << 0x10;
    auVar4 = psllw(auVar4,8);
    uStack_18 = CONCAT22(auVar4._2_2_ + uVar2,auVar4._0_2_ + (short)uVar3);
  }
  else {
    local_20 = 0;
    uStack_1a = 0;
    uStack_18 = 0;
  }
  QVar1.ct.argb.alpha = 0xffff;
  QVar1.cspec = local_20;
  QVar1.ct.argb.red = uStack_1a;
  QVar1.ct._4_4_ = uStack_18;
  QVar1.ct.argb.pad = 0;
  QVar1._14_2_ = uStack_12;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

const QColor QColormap::colorAt(uint pixel) const
{
    if (d->mode == Direct) {
        if (d->depth == 16) {
            pixel = qt_conv16ToRgb(pixel);
        }
        const int red_shift = 16;
        const int green_shift = 8;
        const int red_mask   = 0xff0000;
        const int green_mask = 0x00ff00;
        const int blue_mask  = 0x0000ff;
        return QColor((pixel & red_mask) >> red_shift,
                      (pixel & green_mask) >> green_shift,
                      (pixel & blue_mask));
    }
#if 0 // XXX
    Q_ASSERT_X(int(pixel) < qt_screen->numCols(), "QColormap::colorAt", "pixel out of bounds of palette");
    return QColor(qt_screen->clut()[pixel]);
#endif
    return QColor();
}